

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

int __thiscall CImage::LoadBmp(CImage *this,char *szFilename)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  unsigned_short *puVar3;
  long lVar4;
  size_t sVar5;
  uchar *puVar6;
  short sVar7;
  uint X;
  long Dummy;
  size_t local_4b0;
  long biSize;
  _BMPFILEHEADER fh;
  _BMPIMAGEHEADEROLD ih_old;
  uint local_474;
  unsigned_short local_46a [25];
  uchar BmpPal [256] [4];
  
  Dummy = 0;
  __stream = fopen(szFilename,"rb");
  this->f = (FILE *)__stream;
  if (__stream == (FILE *)0x0) {
    iVar1 = 0x1e;
  }
  else {
    sVar2 = fread(&fh,0xe,1,__stream);
    iVar1 = 0x1f;
    if (sVar2 == 1) {
      if (fh.bfType == 0x4d42) {
        sVar2 = fread(&biSize,4,1,(FILE *)this->f);
        if (sVar2 == 1) {
          fseek((FILE *)this->f,-4,1);
          if (biSize < 0xd) {
            sVar2 = fread(&ih_old,biSize,1,(FILE *)this->f);
            if (sVar2 != 1) {
              return 0x1f;
            }
            puVar3 = &ih_old.biBitCount;
            X = (uint)ih_old.biWidth;
            local_474 = (uint)ih_old.biHeight;
          }
          else {
            sVar2 = fread(&ih_old,biSize,1,(FILE *)this->f);
            if (sVar2 != 1) {
              return 0x1f;
            }
            puVar3 = local_46a;
            X = CONCAT22(ih_old.biHeight,ih_old.biWidth);
          }
          iVar1 = Init(this,X,local_474,*puVar3);
          if (iVar1 == 0) {
            if (this->m_BitPerPixel == 0x18) {
              puVar6 = this->m_pBitmap + (long)this->m_NumPixel * 3;
              sVar2 = (long)((this->m_Xres * 3 + 3) / 4) * 4 + (long)this->m_Xres * -3;
              for (sVar7 = 0; (int)sVar7 < this->m_Yres; sVar7 = sVar7 + 1) {
                puVar6 = puVar6 + (long)this->m_Xres * -3;
                sVar5 = fread(puVar6,(long)this->m_Xres * 3,1,(FILE *)this->f);
                if (sVar5 != 1) {
                  return 0x1f;
                }
                if ((0 < (int)sVar2) && (sVar5 = fread(&Dummy,sVar2,1,(FILE *)this->f), sVar5 != 1))
                {
                  return 0x1f;
                }
              }
            }
            else {
              if (this->m_BitPerPixel != 8) {
                return 0x22;
              }
              iVar1 = this->m_Xres;
              sVar2 = fread(BmpPal,0x400,1,(FILE *)this->f);
              if (sVar2 != 1) {
                return 0x1f;
              }
              iVar1 = ((iVar1 + 3) / 4) * 4 - iVar1;
              local_4b0 = (size_t)iVar1;
              puVar6 = BmpPal[0] + 2;
              for (lVar4 = 0x16; lVar4 != 0x316; lVar4 = lVar4 + 3) {
                *(uchar *)((long)this->m_Pal + lVar4 + -0x16) = (*(uchar (*) [4])(puVar6 + -2))[0];
                *(uchar *)((long)(this->m_Pal + -7) + lVar4) = puVar6[-1];
                *(uchar *)((long)this->m_Pal + lVar4 + -0x14) = *puVar6;
                puVar6 = puVar6 + 4;
              }
              puVar6 = this->m_pBitmap + this->m_NumPixel;
              for (sVar7 = 0; (int)sVar7 < this->m_Yres; sVar7 = sVar7 + 1) {
                puVar6 = puVar6 + -(long)this->m_Xres;
                sVar2 = fread(puVar6,(long)this->m_Xres,1,(FILE *)this->f);
                if (sVar2 != 1) {
                  return 0x1f;
                }
                if ((0 < iVar1) && (sVar2 = fread(&Dummy,local_4b0,1,(FILE *)this->f), sVar2 != 1))
                {
                  return 0x1f;
                }
              }
            }
            fclose((FILE *)this->f);
            iVar1 = 0;
          }
          else {
            iVar1 = 0x21;
          }
        }
      }
      else {
        iVar1 = 0x20;
      }
    }
  }
  return iVar1;
}

Assistant:

int CImage::LoadBmp(char *szFilename)
{
  _BMPFILEHEADER     fh;
  _BMPIMAGEHEADEROLD ih_old;
  _BMPIMAGEHEADER    ih;
  unsigned char      BmpPal[256][4];
  long int           biSize; 
  long int           SuffLen;
  long int           Dummy = 0;
  unsigned char    * pBuf;
  short              i;
  long int           xres, yres;
  unsigned short     bits;

  if (!(f = fopen(szFilename, "rb"))) return eLoadBmpFileOpen;
  if (fread(&fh, 14, 1, f) != 1) return eLoadBmpFileRead;
  if (fh.bfType != 0x4D42) return eLoadBmpBadFormat;
  if (fread(&biSize, 4, 1, f) != 1) return eLoadBmpFileRead;
  if (biSize > 12)
  {
    fseek( f, -4, SEEK_CUR );
    if (fread(&ih, biSize, 1, f) != 1) return eLoadBmpFileRead;
    xres = ih.biWidth;
    yres = ih.biHeight;
    bits = ih.biBitCount;
  }
  else
  {
    fseek( f, -4, SEEK_CUR );
    if (fread(&ih_old, biSize, 1, f) != 1) return eLoadBmpFileRead;
    xres = ih_old.biWidth;
    yres = ih_old.biHeight;
    bits = ih_old.biBitCount;
  }

  if ( Init( xres, yres, bits ) != 0 ) return eLoadBmpInit;
  if (m_BitPerPixel==8)
  {
    SuffLen=((m_Xres+3)/4)*4-m_Xres;
    if (fread(&BmpPal, 1024, 1, f) != 1) return eLoadBmpFileRead;
    for (i=0; i<256; i++)
    {
      m_Pal[i].b=BmpPal[i][0];
      m_Pal[i].g=BmpPal[i][1];
      m_Pal[i].r=BmpPal[i][2];
    }
    pBuf=m_pBitmap;
    pBuf+=m_NumPixel;
    for (i=0; i<m_Yres; i++)
    {
      pBuf-=m_Xres;
      if (fread(pBuf, m_Xres, 1, f) != 1) return eLoadBmpFileRead;
      if (SuffLen>0) 
      { 
        if (fread(&Dummy, SuffLen, 1, f) != 1) return eLoadBmpFileRead; 
      }
    }
  } 
  else
  if (m_BitPerPixel==24)
  {
    SuffLen=((m_Xres*3+3)/4)*4-(m_Xres*3);
    pBuf=m_pBitmap;
    pBuf+=m_NumPixel*3;
    for (i=0; i<m_Yres; i++)
    {
      pBuf-=m_Xres*3;
      if (fread(pBuf, m_Xres*3, 1, f) != 1) return eLoadBmpFileRead;
      if (SuffLen>0) 
      { 
        if (fread(&Dummy, SuffLen, 1, f) != 1) return eLoadBmpFileRead; 
      }
    }
  } 
  else 
    return eLoadBmpColorDepth;

  fclose(f);

  return 0;
}